

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qppmhandler.cpp
# Opt level: O1

ssize_t __thiscall QPpmHandler::read(QPpmHandler *this,int __fd,void *__buf,size_t __nbytes)

{
  uint *puVar1;
  uchar *puVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  QSize size;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  QIODevice *d;
  byte *pbVar11;
  ulong uVar12;
  uint *puVar13;
  ushort *puVar14;
  uchar *puVar15;
  ulong uVar16;
  byte bVar17;
  qsizetype i;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  ushort uVar22;
  Format format;
  int iVar23;
  undefined4 in_register_00000034;
  QImage *image;
  ushort uVar24;
  long lVar25;
  ushort *puVar26;
  byte *pbVar27;
  byte bVar28;
  int i_1;
  State SVar29;
  int iVar30;
  long lVar31;
  long in_FS_OFFSET;
  byte local_b0;
  uint local_68;
  bool local_39;
  long local_38;
  
  image = (QImage *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->state == Error) {
    uVar16 = 0;
    goto LAB_002b9c54;
  }
  if ((this->state != Ready) || (bVar6 = readHeader(this), bVar6)) {
    d = QImageIOHandler::device(&this->super_QImageIOHandler);
    bVar17 = this->type;
    uVar18 = (ulong)bVar17;
    uVar16 = 0;
    SVar29 = Error;
    if (uVar18 < 0x37) {
      iVar3 = this->width;
      uVar4 = this->height;
      size.wd.m_i = this->width;
      size.ht.m_i = this->height;
      uVar5 = this->mcc;
      if ((0x12000000000000U >> (uVar18 & 0x3f) & 1) == 0) {
        if ((0x24000000000000U >> (uVar18 & 0x3f) & 1) != 0) {
          lVar21 = 8;
          uVar16 = 1;
          format = Format_Grayscale8;
          local_b0 = 0;
          goto LAB_002b94b7;
        }
        if ((0x48000000000000U >> (uVar18 & 0x3f) & 1) == 0) goto LAB_002b9c50;
        lVar21 = 0x20;
        bVar6 = true;
        format = Format_RGB32;
        local_b0 = 0;
        uVar16 = 0;
      }
      else {
        lVar21 = 1;
        local_b0 = 1;
        format = Format_Mono;
LAB_002b94b7:
        bVar6 = false;
      }
      bVar7 = QImageIOHandler::allocateImage(size,format,image);
      if (!bVar7) goto LAB_002b97d2;
      lVar31 = (long)iVar3;
      lVar21 = lVar21 * lVar31;
      lVar25 = lVar21 + 7;
      lVar19 = lVar21 + 0xe;
      if (-1 < lVar25) {
        lVar19 = lVar25;
      }
      uVar18 = lVar19 >> 3;
      bVar28 = (byte)uVar16;
      if ((char)bVar17 < '4') {
        local_39 = true;
        if ((int)uVar4 < 1) {
          uVar16 = 1;
        }
        else {
          lVar19 = lVar21 + 0x26;
          if (-1 < lVar25) {
            lVar19 = lVar25;
          }
          local_68 = uVar5 & 0xffff;
          lVar25 = (lVar19 >> 5) + -1;
          iVar23 = 0;
          do {
            puVar15 = QImage::scanLine(image,iVar23);
            if (local_b0 == 0) {
              if (bVar28 == 0) {
                bVar17 = lVar21 - 0x19U < 0xffffffffffffffc1 & local_39;
                if (uVar5 == 0xff) {
                  if (bVar17 != 0) {
                    lVar19 = 0;
                    do {
                      iVar9 = read_pbm_int(d,&local_39,-1);
                      uVar20 = read_pbm_int(d,&local_39,-1);
                      uVar8 = read_pbm_int(d,&local_39,-1);
                      *(uint *)(puVar15 + lVar19 * 4) =
                           uVar8 & 0xff | (uVar20 & 0xff) << 8 | iVar9 << 0x10 | 0xff000000;
                      if (lVar25 == lVar19) break;
                      lVar19 = lVar19 + 1;
                    } while ((local_39 & 1U) != 0);
                  }
                }
                else if (bVar17 != 0) {
                  lVar19 = 0;
                  do {
                    uVar20 = read_pbm_int(d,&local_39,-1);
                    uVar8 = read_pbm_int(d,&local_39,-1);
                    uVar10 = read_pbm_int(d,&local_39,-1);
                    uVar16 = (ulong)((uVar20 * 0x10000 - (uVar20 & 0xffff)) / local_68 & 0xffff) +
                             0x8000000080 +
                             ((ulong)((uVar10 * 0x10000 - (uVar10 & 0xffff)) / local_68 & 0xffff) <<
                             0x20);
                    uVar20 = ((uVar8 * 0x10000 - (uVar8 & 0xffff)) / local_68 & 0xffff) + 0x80;
                    lVar31 = uVar16 - (uVar16 >> 8 & 0x1ff000001ff);
                    *(uint *)(puVar15 + lVar19 * 4) =
                         ((uint)((ulong)lVar31 >> 0x28) & 0xff) +
                         (uVar20 - (uVar20 >> 8) & 0xff00 | ((uint)lVar31 & 0xff00) << 8) +
                         -0x1000000;
                    if (lVar25 == lVar19) break;
                    lVar19 = lVar19 + 1;
                  } while ((local_39 & 1U) != 0);
                }
              }
              else {
                bVar17 = lVar21 - 1U < 0xfffffffffffffff1 & local_39;
                if (uVar5 == 0xff) {
                  if (bVar17 != 0) {
                    lVar19 = 0;
                    do {
                      iVar9 = read_pbm_int(d,&local_39,-1);
                      puVar15[lVar19] = (uchar)iVar9;
                      if (uVar18 - 1 == lVar19) break;
                      lVar19 = lVar19 + 1;
                    } while ((local_39 & 1U) != 0);
                  }
                }
                else if (bVar17 != 0) {
                  lVar19 = 0;
                  do {
                    uVar20 = read_pbm_int(d,&local_39,-1);
                    puVar15[lVar19] = (uchar)((int)((uVar20 & 0xffff) * 0xff) / (int)uVar5);
                    if (uVar18 - 1 == lVar19) break;
                    lVar19 = lVar19 + 1;
                  } while ((local_39 & 1U) != 0);
                }
              }
            }
            else {
              uVar16 = uVar18;
              iVar9 = iVar3;
              if ((lVar21 - 1U < 0xfffffffffffffff1 & local_39) == 1) {
                do {
                  iVar30 = 0;
                  uVar20 = 0;
                  do {
                    uVar20 = uVar20 * 2;
                    if (iVar30 < iVar9) {
                      uVar8 = read_pbm_int(d,&local_39,1);
                      uVar20 = uVar20 | uVar8 & 1;
                    }
                    iVar30 = iVar30 + 1;
                  } while (iVar30 != 8);
                  *puVar15 = (uchar)uVar20;
                  if (uVar16 - 1 == 0) break;
                  puVar15 = puVar15 + 1;
                  uVar16 = uVar16 - 1;
                  iVar9 = iVar9 + -8;
                } while ((local_39 & 1U) != 0);
              }
            }
            iVar23 = iVar23 + 1;
            uVar16 = CONCAT71((int7)((ulong)puVar15 >> 8),local_39);
          } while ((iVar23 < (int)uVar4) && ((local_39 & 1U) != 0));
        }
LAB_002b9bf8:
        bVar17 = (byte)uVar16;
joined_r0x002b97c7:
        if ((local_b0 & bVar17) != 0) goto LAB_002b9c04;
        if ((uVar16 & 1) == 0) {
LAB_002b9c4a:
          uVar16 = 0;
          SVar29 = Error;
          goto LAB_002b9c50;
        }
      }
      else {
        if (bVar6) {
          uVar18 = (ulong)(int)(((uint)(0xff < (int)uVar5) * 3 + 3) * iVar3);
          pbVar11 = (byte *)operator_new__(uVar18);
          uVar16 = (ulong)((int)uVar4 < 1);
          if (0 < (int)uVar4) {
            uVar12 = QIODevice::read((char *)d,(longlong)pbVar11);
            uVar16 = 0;
            if (uVar12 == uVar18) {
              uVar20 = uVar5 & 0xffff;
              do {
                puVar13 = (uint *)QImage::scanLine(image,(int)uVar16);
                if (0 < iVar3) {
                  puVar1 = puVar13 + lVar31;
                  pbVar27 = pbVar11;
                  do {
                    bVar17 = *pbVar27;
                    if ((int)uVar5 < 0x100) {
                      if (uVar5 == 0xff) {
                        uVar8 = (uint)pbVar27[1] << 8 | (uint)bVar17 << 0x10 | (uint)pbVar27[2];
                      }
                      else {
                        uVar12 = (ulong)(((uint)bVar17 * 0xffff) / uVar20 & 0xffff) + 0x8000000080 +
                                 ((ulong)(((uint)pbVar27[2] * 0x10000 - (uint)pbVar27[2]) / uVar20 &
                                         0xffff) << 0x20);
                        uVar8 = (((uint)pbVar27[1] * 0x10000 - (uint)pbVar27[1]) / uVar20 & 0xffff)
                                + 0x80;
                        lVar21 = uVar12 - (uVar12 >> 8 & 0x1ff000001ff);
                        uVar8 = (uint)((ulong)lVar21 >> 0x28) & 0xff |
                                uVar8 - (uVar8 >> 8) & 0xff00 | ((uint)lVar21 & 0xff00) << 8;
                      }
                      lVar21 = 3;
                    }
                    else {
                      uVar22 = *(ushort *)(pbVar27 + 2) << 8 | *(ushort *)(pbVar27 + 2) >> 8;
                      uVar24 = *(ushort *)(pbVar27 + 4) << 8 | *(ushort *)(pbVar27 + 4) >> 8;
                      if (uVar5 == 0xffff) {
                        uVar12 = ((ulong)uVar24 << 0x20 | (ulong)CONCAT11(bVar17,pbVar27[1])) +
                                 0x8000000080;
                        iVar23 = (int)((ulong)uVar22 + 0x1007f00000080);
                        lVar25 = uVar12 - (uVar12 >> 8 & 0x1ff000001ff);
                        uVar8 = (uint)((ulong)uVar22 + 0x1007f00000080 >> 8);
                      }
                      else {
                        uVar12 = (ulong)(((uint)CONCAT11(bVar17,pbVar27[1]) * 0xffff) / uVar20 &
                                        0xffff) + 0x8000000080 +
                                 ((ulong)(((uint)uVar24 * 0xffff) / uVar20 & 0xffff) << 0x20);
                        lVar21 = (ulong)(((uint)uVar22 * 0x10000 - (uint)uVar22) / uVar20 & 0xffff)
                                 + 0x1007f00000080;
                        iVar23 = (int)lVar21;
                        lVar25 = uVar12 - (uVar12 >> 8 & 0x1ff000001ff);
                        uVar8 = (uint)((ulong)lVar21 >> 8) & 0x1ff;
                      }
                      uVar8 = (uint)((ulong)lVar25 >> 0x28) & 0xff |
                              iVar23 - uVar8 & 0xff00 | ((uint)lVar25 & 0xff00) << 8;
                      lVar21 = 6;
                    }
                    *puVar13 = uVar8 | 0xff000000;
                    pbVar27 = pbVar27 + lVar21;
                    puVar13 = puVar13 + 1;
                  } while (puVar13 < puVar1);
                }
                uVar8 = (int)uVar16 + 1;
                uVar16 = (ulong)uVar8;
              } while ((uVar8 != uVar4) &&
                      (uVar12 = QIODevice::read((char *)d,(longlong)pbVar11), uVar12 == uVar18));
              uVar16 = (ulong)CONCAT31((int3)(uVar8 >> 8),(int)uVar4 <= (int)uVar8);
            }
          }
          operator_delete__(pbVar11);
          bVar17 = (byte)uVar16;
          goto joined_r0x002b97c7;
        }
        if ((0xff < (int)uVar5 & bVar28) != 0) {
          uVar18 = lVar31 * 2;
          puVar14 = (ushort *)operator_new__(uVar18);
          uVar16 = (ulong)((int)uVar4 < 1);
          if ((0 < (int)uVar4) &&
             (uVar12 = QIODevice::read((char *)d,(longlong)puVar14), uVar12 == uVar18)) {
            uVar20 = 0;
            do {
              puVar15 = QImage::scanLine(image,uVar20);
              if (0 < iVar3) {
                puVar2 = puVar15 + lVar31;
                puVar26 = puVar14;
                do {
                  uVar22 = *puVar26 << 8 | *puVar26 >> 8;
                  *puVar15 = (uchar)(((uint)uVar22 * 0x100 - (uint)uVar22) / uVar5);
                  puVar15 = puVar15 + 1;
                  puVar26 = puVar26 + 1;
                } while (puVar15 < puVar2);
              }
              uVar20 = uVar20 + 1;
            } while ((uVar20 != uVar4) &&
                    (uVar16 = QIODevice::read((char *)d,(longlong)puVar14), uVar16 == uVar18));
            uVar16 = (ulong)((int)uVar4 <= (int)uVar20);
          }
          operator_delete__(puVar14);
          goto LAB_002b9bf8;
        }
        if (0 < (int)uVar4) {
          uVar16 = 1;
          if (1 < (long)uVar18) {
            uVar16 = uVar18;
          }
          uVar20 = 0;
          do {
            puVar15 = QImage::scanLine(image,uVar20);
            uVar12 = QIODevice::read((char *)d,(longlong)puVar15);
            if (uVar12 != uVar18) goto LAB_002b9c4a;
            if ((0 < lVar21 & (int)uVar5 < 0xff & bVar28) != 0) {
              uVar12 = 0;
              do {
                puVar15[uVar12] =
                     (uchar)((int)((uint)puVar15[uVar12] * 0x100 - (uint)puVar15[uVar12]) /
                            (int)uVar5);
                uVar12 = uVar12 + 1;
              } while (uVar16 != uVar12);
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 != uVar4);
        }
        if (local_b0 == 0) goto LAB_002b9c3f;
LAB_002b9c04:
        QImage::setColorCount(image,2);
        QImage::setColor(image,0,0xffffffff);
        QImage::setColor(image,1,0xff000000);
      }
LAB_002b9c3f:
      uVar16 = CONCAT71((int7)(uVar16 >> 8),1);
      SVar29 = Ready;
    }
  }
  else {
LAB_002b97d2:
    SVar29 = Error;
    uVar16 = 0;
  }
LAB_002b9c50:
  this->state = SVar29;
LAB_002b9c54:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar16 & 0xffffffff;
  }
  __stack_chk_fail();
}

Assistant:

bool QPpmHandler::read(QImage *image)
{
    if (state == Error)
        return false;

    if (state == Ready && !readHeader()) {
        state = Error;
        return false;
    }

    if (!read_pbm_body(device(), type, width, height, mcc, image)) {
        state = Error;
        return false;
    }

    state = Ready;
    return true;
}